

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O0

string * __thiscall Tracker::logFramerate_abi_cxx11_(string *__return_storage_ptr__,Tracker *this)

{
  double local_60;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Tracker *local_18;
  Tracker *this_local;
  
  local_18 = this;
  this_local = (Tracker *)__return_storage_ptr__;
  local_60 = getFramerate(this);
  vera::toString<double>(&local_58,&local_60);
  std::operator+(&local_38,"framerate,",&local_58);
  std::operator+(__return_storage_ptr__,&local_38,"\n");
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string Tracker::logFramerate() {
    return  "framerate," + vera::toString(getFramerate()) + "\n";// +
            // "fps," + vera::toString( (1./getFramerate()) * 1000.0 ) ;
}